

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O3

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::write_printf<int>
          (writer_base<cppwinrt::writer> *this,char *format,int *args)

{
  uint uVar1;
  ulong uVar2;
  char buffer [128];
  char acStack_88 [128];
  
  uVar1 = snprintf(acStack_88,0x80,format,(ulong)(uint)*args);
  if (uVar1 < 0x80) {
    uVar2 = (ulong)uVar1;
  }
  else {
    write_printf<int>();
    uVar2 = 0x7f;
  }
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)&this->m_first,
             (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,acStack_88,acStack_88 + uVar2);
  return;
}

Assistant:

void write_printf(char const* format, Args const&... args)
        {
            char buffer[128];
#if defined(_WIN32) || defined(_WIN64)
            size_t const size = sprintf_s(buffer, format, args...);
#else
            size_t size = snprintf(buffer, sizeof(buffer), format, args...);
            if (size > sizeof(buffer) - 1)
            {
                fprintf(stderr, "\n*** WARNING: writer_base::write_printf -- buffer too small\n");
                size = sizeof(buffer) - 1;
            }
#endif
            write(std::string_view{ buffer, size });
        }